

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
          (Vector<glm::vec<3,float,(glm::qualifier)0>> *this,float *args,int *args_1,int *args_2)

{
  float _x;
  int _y;
  long lVar1;
  long lVar2;
  float *pfVar3;
  int *piVar4;
  int *args_local_2;
  int *args_local_1;
  float *args_local;
  Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::grow
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)this,*(long *)(this + 0x10) + 1);
  }
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  pfVar3 = forward<float>(args);
  _x = *pfVar3;
  piVar4 = forward<int>(args_1);
  _y = *piVar4;
  piVar4 = forward<int>(args_2);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
            ((vec<3,float,(glm::qualifier)0> *)(lVar1 + lVar2 * 0xc),_x,_y,*piVar4);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void Vector<T>::emplace_back(Args&&... args)noexcept
{
    if(_size == _capacity)
        grow(_capacity+1);
    new ((void*)&_data[_size]) T(tl::forward<Args>(args)...);
    _size++;
}